

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

uv_handle_type uv__handle_type(int fd)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_handle_type uVar3;
  int type;
  socklen_t len;
  socklen_t sslen;
  sockaddr_storage ss;
  
  ss.ss_family = 0;
  ss.__ss_padding[0] = '\0';
  ss.__ss_padding[1] = '\0';
  ss.__ss_padding[2] = '\0';
  ss.__ss_padding[3] = '\0';
  ss.__ss_padding[4] = '\0';
  ss.__ss_padding[5] = '\0';
  ss.__ss_padding[6] = '\0';
  ss.__ss_padding[7] = '\0';
  ss.__ss_padding[8] = '\0';
  ss.__ss_padding[9] = '\0';
  ss.__ss_padding[10] = '\0';
  ss.__ss_padding[0xb] = '\0';
  ss.__ss_padding[0xc] = '\0';
  ss.__ss_padding[0xd] = '\0';
  ss.__ss_padding[0xe] = '\0';
  ss.__ss_padding[0xf] = '\0';
  ss.__ss_padding[0x10] = '\0';
  ss.__ss_padding[0x11] = '\0';
  ss.__ss_padding[0x12] = '\0';
  ss.__ss_padding[0x13] = '\0';
  ss.__ss_padding[0x14] = '\0';
  ss.__ss_padding[0x15] = '\0';
  ss.__ss_padding[0x16] = '\0';
  ss.__ss_padding[0x17] = '\0';
  ss.__ss_padding[0x18] = '\0';
  ss.__ss_padding[0x19] = '\0';
  ss.__ss_padding[0x1a] = '\0';
  ss.__ss_padding[0x1b] = '\0';
  ss.__ss_padding[0x1c] = '\0';
  ss.__ss_padding[0x1d] = '\0';
  ss.__ss_padding[0x1e] = '\0';
  ss.__ss_padding[0x1f] = '\0';
  ss.__ss_padding[0x20] = '\0';
  ss.__ss_padding[0x21] = '\0';
  ss.__ss_padding[0x22] = '\0';
  ss.__ss_padding[0x23] = '\0';
  ss.__ss_padding[0x24] = '\0';
  ss.__ss_padding[0x25] = '\0';
  ss.__ss_padding[0x26] = '\0';
  ss.__ss_padding[0x27] = '\0';
  ss.__ss_padding[0x28] = '\0';
  ss.__ss_padding[0x29] = '\0';
  ss.__ss_padding[0x2a] = '\0';
  ss.__ss_padding[0x2b] = '\0';
  ss.__ss_padding[0x2c] = '\0';
  ss.__ss_padding[0x2d] = '\0';
  ss.__ss_padding[0x2e] = '\0';
  ss.__ss_padding[0x2f] = '\0';
  ss.__ss_padding[0x30] = '\0';
  ss.__ss_padding[0x31] = '\0';
  ss.__ss_padding[0x32] = '\0';
  ss.__ss_padding[0x33] = '\0';
  ss.__ss_padding[0x34] = '\0';
  ss.__ss_padding[0x35] = '\0';
  ss.__ss_padding[0x36] = '\0';
  ss.__ss_padding[0x37] = '\0';
  ss.__ss_padding[0x38] = '\0';
  ss.__ss_padding[0x39] = '\0';
  ss.__ss_padding[0x3a] = '\0';
  ss.__ss_padding[0x3b] = '\0';
  ss.__ss_padding[0x3c] = '\0';
  ss.__ss_padding[0x3d] = '\0';
  ss.__ss_padding[0x3e] = '\0';
  ss.__ss_padding[0x3f] = '\0';
  ss.__ss_padding[0x40] = '\0';
  ss.__ss_padding[0x41] = '\0';
  ss.__ss_padding[0x42] = '\0';
  ss.__ss_padding[0x43] = '\0';
  ss.__ss_padding[0x44] = '\0';
  ss.__ss_padding[0x45] = '\0';
  ss.__ss_padding[0x46] = '\0';
  ss.__ss_padding[0x47] = '\0';
  ss.__ss_padding[0x48] = '\0';
  ss.__ss_padding[0x49] = '\0';
  ss.__ss_padding[0x4a] = '\0';
  ss.__ss_padding[0x4b] = '\0';
  ss.__ss_padding[0x4c] = '\0';
  ss.__ss_padding[0x4d] = '\0';
  ss.__ss_padding[0x4e] = '\0';
  ss.__ss_padding[0x4f] = '\0';
  ss.__ss_padding[0x50] = '\0';
  ss.__ss_padding[0x51] = '\0';
  ss.__ss_padding[0x52] = '\0';
  ss.__ss_padding[0x53] = '\0';
  ss.__ss_padding[0x54] = '\0';
  ss.__ss_padding[0x55] = '\0';
  ss.__ss_padding[0x56] = '\0';
  ss.__ss_padding[0x57] = '\0';
  ss.__ss_padding[0x58] = '\0';
  ss.__ss_padding[0x59] = '\0';
  ss.__ss_padding[0x5a] = '\0';
  ss.__ss_padding[0x5b] = '\0';
  ss.__ss_padding[0x5c] = '\0';
  ss.__ss_padding[0x5d] = '\0';
  ss.__ss_padding[0x5e] = '\0';
  ss.__ss_padding[0x5f] = '\0';
  ss.__ss_padding[0x60] = '\0';
  ss.__ss_padding[0x61] = '\0';
  ss.__ss_padding[0x62] = '\0';
  ss.__ss_padding[99] = '\0';
  ss.__ss_padding[100] = '\0';
  ss.__ss_padding[0x65] = '\0';
  ss.__ss_padding[0x66] = '\0';
  ss.__ss_padding[0x67] = '\0';
  ss.__ss_padding[0x68] = '\0';
  ss.__ss_padding[0x69] = '\0';
  ss.__ss_padding[0x6a] = '\0';
  ss.__ss_padding[0x6b] = '\0';
  ss.__ss_padding[0x6c] = '\0';
  ss.__ss_padding[0x6d] = '\0';
  ss.__ss_padding[0x6e] = '\0';
  ss.__ss_padding[0x6f] = '\0';
  ss.__ss_padding[0x70] = '\0';
  ss.__ss_padding[0x71] = '\0';
  ss.__ss_padding[0x72] = '\0';
  ss.__ss_padding[0x73] = '\0';
  ss.__ss_padding[0x74] = '\0';
  ss.__ss_padding[0x75] = '\0';
  ss.__ss_align = 0;
  sslen = 0x80;
  iVar1 = getsockname(fd,(sockaddr *)&ss,&sslen);
  uVar2 = UV_UNKNOWN_HANDLE;
  uVar3 = UV_UNKNOWN_HANDLE;
  if (iVar1 == 0) {
    len = 4;
    iVar1 = getsockopt(fd,1,3,&type,&len);
    if (iVar1 == 0) {
      uVar3 = uVar2;
      if (type == 2) {
        if ((ss.ss_family & 0xfff7) == 2) {
          uVar3 = UV_UDP;
        }
      }
      else if (type == 1) {
        if (ss.ss_family == 1) {
          uVar3 = UV_NAMED_PIPE;
        }
        else if ((ss.ss_family == 10) || (ss.ss_family == 2)) {
          uVar3 = UV_TCP;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

uv_handle_type uv__handle_type(int fd) {
  struct sockaddr_storage ss;
  socklen_t sslen;
  socklen_t len;
  int type;

  memset(&ss, 0, sizeof(ss));
  sslen = sizeof(ss);

  if (getsockname(fd, (struct sockaddr*)&ss, &sslen))
    return UV_UNKNOWN_HANDLE;

  len = sizeof type;

  if (getsockopt(fd, SOL_SOCKET, SO_TYPE, &type, &len))
    return UV_UNKNOWN_HANDLE;

  if (type == SOCK_STREAM) {
#if defined(_AIX) || defined(__DragonFly__)
    /* on AIX/DragonFly the getsockname call returns an empty sa structure
     * for sockets of type AF_UNIX.  For all other types it will
     * return a properly filled in structure.
     */
    if (sslen == 0)
      return UV_NAMED_PIPE;
#endif
    switch (ss.ss_family) {
      case AF_UNIX:
        return UV_NAMED_PIPE;
      case AF_INET:
      case AF_INET6:
        return UV_TCP;
      }
  }

  if (type == SOCK_DGRAM &&
      (ss.ss_family == AF_INET || ss.ss_family == AF_INET6))
    return UV_UDP;

  return UV_UNKNOWN_HANDLE;
}